

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O1

CompileMessage *
soul::CompileMessageHelpers::createMessage<>
          (CompileMessage *__return_storage_ptr__,Category category,Type type,char *text)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  createMessage<>(__return_storage_ptr__,category,&local_18,type,text);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CompileMessage::Type type,
                                         const char* text, Args&&... args)
    {
        return createMessage (category, CodeLocation(), type, text, std::forward<Args> (args)...);
    }